

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int vrna_E_ext_stem(uint type,int n5d,int n3d,vrna_param_t *p)

{
  int iVar1;
  int *piVar2;
  
  if ((n3d | n5d) < 0) {
    if (n5d < 0) {
      if (n3d < 0) {
        iVar1 = 0;
        goto LAB_00118eed;
      }
      piVar2 = p->dangle3[type] + (uint)n3d;
    }
    else {
      piVar2 = p->dangle5[type] + (uint)n5d;
    }
  }
  else {
    piVar2 = p->mismatchExt[type][(uint)n5d] + (uint)n3d;
  }
  iVar1 = *piVar2;
LAB_00118eed:
  if (2 < type) {
    iVar1 = iVar1 + p->TerminalAU;
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_E_ext_stem(unsigned int  type,
                int           n5d,
                int           n3d,
                vrna_param_t  *p)
{
  int energy = 0;

  if (n5d >= 0 && n3d >= 0)
    energy += p->mismatchExt[type][n5d][n3d];
  else if (n5d >= 0)
    energy += p->dangle5[type][n5d];
  else if (n3d >= 0)
    energy += p->dangle3[type][n3d];

  if (type > 2)
    energy += p->TerminalAU;

  return energy;
}